

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t main(wchar_t argc,char **argv)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  __mode_t __mask;
  wchar_t wVar6;
  char *__s;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  tm *__tp;
  long *__s_00;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  byte bVar14;
  byte *pbVar15;
  char **ppcVar16;
  ulong uVar17;
  char *__s_01;
  uint uVar18;
  long *plVar19;
  ulong uVar20;
  int iVar21;
  int *piVar22;
  bool bVar23;
  time_t now;
  wchar_t test_set [33];
  char tmpdir [256];
  sigaction sa;
  char tmpdir_timestamp [256];
  char *local_770;
  uint local_764;
  char **local_760;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_730;
  time_t local_710;
  uint local_708 [36];
  char local_678 [256];
  char local_578 [64];
  _union_1457 local_538;
  sigset_t local_530;
  undefined4 local_4b0;
  char local_138 [264];
  
  __s = getcwd((char *)0x0,0x1000);
  sVar7 = strlen(__s);
  cVar2 = __s[sVar7 - 1];
  while (cVar2 == '\n') {
    __s[sVar7 - 1] = '\0';
    sVar7 = strlen(__s);
    cVar2 = __s[sVar7 - 1];
  }
  __s_01 = *argv;
  sVar7 = strlen(__s_01);
  pcVar10 = (char *)(sVar7 + 1);
  __dest = (char *)malloc((size_t)pcVar10);
  if (__dest == (char *)0x0) goto LAB_00108a24;
  strcpy(__dest,__s_01);
  iVar11 = 0;
  iVar21 = 0;
  pcVar10 = __s_01;
  while( true ) {
    pcVar8 = pcVar10 + 1;
    cVar2 = *pcVar10;
    pcVar10 = pcVar8;
    iVar12 = iVar11;
    if (((cVar2 != '/') && (cVar2 != '\\')) && (pcVar10 = __s_01, iVar12 = iVar21, cVar2 == '\0'))
    break;
    iVar11 = iVar11 + 1;
    __s_01 = pcVar10;
    iVar21 = iVar12;
    pcVar10 = pcVar8;
  }
  __dest[iVar21] = '\0';
  if (*__dest == '/') {
LAB_00107c02:
    testprogfile = getenv("BSDCPIO");
    local_770 = getenv("TMPDIR");
    if (((local_770 == (char *)0x0) && (local_770 = getenv("TMP"), local_770 == (char *)0x0)) &&
       (local_770 = getenv("TEMP"), local_770 == (char *)0x0)) {
      pcVar10 = getenv("TEMPDIR");
      local_770 = "/tmp";
      if (pcVar10 != (char *)0x0) {
        local_770 = pcVar10;
      }
    }
    pcVar10 = getenv("BSDCPIO_DEBUG");
    if (pcVar10 != (char *)0x0) {
      dump_on_failure = 1;
    }
    pcVar10 = getenv("_VERBOSITY_LEVEL");
    if (pcVar10 == (char *)0x0) {
      bVar23 = true;
    }
    else {
      wVar4 = atoi(pcVar10);
      bVar23 = (uint)(wVar4 + L'\xfffffffd') < 0xfffffffc;
      verbosity = L'\0';
      if (!bVar23) {
        verbosity = wVar4;
      }
    }
    refdir = getenv("BSDCPIO_TEST_FILES");
    ppcVar16 = argv + 1;
    pcVar10 = argv[1];
    wVar4 = verbosity;
    wVar5 = until_failure;
    while ((pcVar10 != (char *)0x0 && (*pcVar10 == '-'))) {
      ppcVar16 = ppcVar16 + 1;
      bVar14 = pcVar10[1];
      if (bVar14 != 0) {
        pbVar13 = (byte *)(pcVar10 + 1);
        do {
          pbVar13 = pbVar13 + 1;
          if ((bVar14 & 0xfd) == 0x70) {
            pbVar15 = pbVar13;
            if (*pbVar13 == 0) {
              pbVar15 = (byte *)*ppcVar16;
              if (pbVar15 == (byte *)0x0) goto LAB_001089e8;
              ppcVar16 = ppcVar16 + 1;
            }
            pbVar13 = (byte *)0x11343c;
          }
          else {
            pbVar15 = (byte *)0x0;
          }
          switch(bVar14) {
          case 0x6b:
            keep_temp_files = 1;
            break;
          case 0x6c:
          case 0x6d:
          case 0x6e:
          case 0x6f:
          case 0x73:
          case 0x74:
            goto switchD_00107d62_caseD_6c;
          case 0x70:
            testprogfile = (char *)pbVar15;
            break;
          case 0x71:
            if (bVar23) {
              wVar4 = wVar4 + L'\xffffffff';
              verbosity = wVar4;
            }
            break;
          case 0x72:
            refdir = (char *)pbVar15;
            break;
          case 0x75:
            wVar5 = wVar5 + L'\x01';
            until_failure = wVar5;
            break;
          case 0x76:
            if (bVar23) {
              wVar4 = wVar4 + L'\x01';
              verbosity = wVar4;
            }
            break;
          default:
            if (bVar14 != 100) goto switchD_00107d62_caseD_6c;
            dump_on_failure = 1;
          }
          bVar14 = *pbVar13;
        } while (bVar14 != 0);
      }
      pcVar10 = *ppcVar16;
    }
    if (testprogfile == (char *)0x0) {
      sVar7 = strlen(__dest);
      pcVar10 = (char *)(sVar7 + 9);
      local_748 = (char *)malloc((size_t)pcVar10);
      if (local_748 == (char *)0x0) goto LAB_00108a2e;
      strcpy(local_748,__dest);
      sVar7 = strlen(local_748);
      (local_748 + sVar7)[0] = '/';
      (local_748 + sVar7)[1] = '\0';
      sVar7 = strlen(local_748);
      builtin_strncpy(local_748 + sVar7,"bsdcpio",8);
      testprogfile = local_748;
    }
    else {
      local_748 = (char *)0x0;
    }
    pcVar10 = testprogfile;
    sVar7 = strlen(testprogfile);
    pcVar8 = (char *)malloc(sVar7 + 3);
    pcVar8[0] = '\"';
    pcVar8[1] = '\0';
    strcat(pcVar8,pcVar10);
    sVar7 = strlen(pcVar8);
    (pcVar8 + sVar7)[0] = '\"';
    (pcVar8 + sVar7)[1] = '\0';
    local_538 = (_union_1457)0x1;
    testprog = pcVar8;
    sigemptyset(&local_530);
    local_4b0 = 0;
    sigaction(0xd,(sigaction *)&local_538,(sigaction *)0x0);
    local_710 = time((time_t *)0x0);
    uVar17 = 0;
    do {
      __tp = localtime(&local_710);
      strftime(local_138,0x100,"%Y-%m-%dT%H.%M.%S",__tp);
      sprintf(local_678,"%s/%s.%s-%03d",local_770,__s_01,local_138,uVar17);
      wVar4 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                                 ,L'ળ',local_678,L'ǭ');
      if (wVar4 != L'\0') goto LAB_00107f5f;
      uVar18 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar18;
    } while (uVar18 != 1000);
    main_cold_7();
LAB_00107f5f:
    plVar19 = (long *)refdir;
    memset(&local_538,0,0x200);
    if (plVar19 == (long *)0x0) {
      __s_00 = (long *)getcwd((char *)0x0,0x1000);
      sVar7 = strlen((char *)__s_00);
      cVar2 = *(char *)((long)__s_00 + (sVar7 - 1));
      while (cVar2 == '\n') {
        *(undefined1 *)((long)__s_00 + (sVar7 - 1)) = 0;
        sVar7 = strlen((char *)__s_00);
        cVar2 = *(char *)((long)__s_00 + (sVar7 - 1));
      }
      snprintf((char *)local_708,0x80,"%s",__s_00);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_708,"test_option_f.cpio.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00108301;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_708,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_708,0x80,"%s/test",__s_00);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_708,"test_option_f.cpio.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00108301;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_708,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_708,0x80,"%s/%s/test",__s_00,"bsdcpio");
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_708,"test_option_f.cpio.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00108301;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_708,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_708,0x80,"%s/%s/test",__s_00,"cpio");
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_708,"test_option_f.cpio.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00108301;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_708,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      if (*__s_00 != 0x6a626f2f7273752f) goto LAB_0010800e;
      plVar19 = __s_00 + 1;
      snprintf((char *)local_708,0x80,"%s",plVar19);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_708,"test_option_f.cpio.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00108301;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_708,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      pcVar10 = "%s/test";
    }
    else {
      pcVar10 = "%s";
      __s_00 = (long *)0x0;
    }
    snprintf((char *)local_708,0x80,pcVar10,plVar19);
    pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_708,"test_option_f.cpio.uu");
    if (pcVar10 == (char *)0x0) {
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_708,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
LAB_0010800e:
      printf("Unable to locate known reference file %s\n","test_option_f.cpio.uu");
      printf("  Checked following directories:\n%s\n",&local_538);
      exit(1);
    }
LAB_00108301:
    free(pcVar10);
    free(__s_00);
    local_750 = strdup((char *)local_708);
    refdir = local_750;
    putchar(10);
    puts("If tests fail or crash, details will be in:");
    printf("   %s\n",local_678);
    putchar(10);
    if (verbosity < L'\0') {
      printf("Running ");
      fflush(_stdout);
    }
    else {
      printf("Reference files will be read from: %s\n",refdir);
      printf("Running tests on: %s\n",testprog);
      printf("Exercising: ");
      fflush(_stdout);
      systemf("%s --version",testprog);
      putchar(10);
    }
    local_764 = 0;
    uVar17 = 0;
    local_760 = ppcVar16;
    do {
      uVar18 = get_test_set((int *)local_708,0x21,*local_760,tests);
      local_740 = __dest;
      local_730 = __s_01;
      if ((int)uVar18 < 0) goto LAB_001089f0;
      if (uVar18 != 0) {
        iVar21 = (int)uVar17;
        uVar20 = 0;
        do {
          wVar4 = failures;
          uVar3 = local_708[uVar20];
          if (verbosity != L'\xffffffff') {
            if (verbosity == L'\0') {
              printf("%3d: %-50s",(ulong)uVar3,tests[(int)uVar3].name);
              fflush(_stdout);
            }
            else {
              printf("%3d: %s\n",(ulong)uVar3,tests[(int)uVar3].name);
            }
          }
          wVar5 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                                  ,L'ँ',local_678);
          if (wVar5 == L'\0') {
LAB_001089d3:
            main_cold_6();
switchD_00107d62_caseD_6c:
            main_cold_2();
LAB_001089e8:
            main_cold_3();
            goto LAB_001089f0;
          }
          sprintf(local_578,"%s.log",tests[(int)uVar3].name);
          logfile = (FILE *)fopen(local_578,"w");
          fprintf((FILE *)logfile,"%s\n\n",tests[(int)uVar3].name);
          snprintf((char *)&local_538,0x400,"%s/%s",local_678,tests[(int)uVar3].name);
          testworkdir = (char *)&local_538;
          wVar5 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                                     ,L'ऍ',(char *)&local_538,L'ǭ');
          if ((wVar5 == L'\0') ||
             (wVar5 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                                      ,L'ऎ',testworkdir), wVar5 == L'\0')) {
            main_cold_5();
LAB_001089c6:
            main_cold_4();
            goto LAB_001089d3;
          }
          setlocale(6,"C");
          __mask = umask(0);
          umask(__mask);
          (*tests[(int)uVar3].func)();
          testworkdir = (char *)0x0;
          umask(__mask);
          setlocale(6,"C");
          wVar6 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                                  ,L'त',local_678);
          wVar5 = failures;
          if (wVar6 == L'\0') goto LAB_001089c6;
          tests[(int)uVar3].failures = failures - wVar4;
          if (verbosity == L'\0') {
            pcVar10 = "FAIL\n";
            if (wVar5 == wVar4) {
              pcVar10 = "ok\n";
            }
            printf(pcVar10);
          }
          else if (verbosity == L'\xffffffff') {
            pcVar10 = "E";
            if (wVar5 == wVar4) {
              pcVar10 = ".";
            }
            printf(pcVar10);
            fflush(_stdout);
          }
          uVar1 = (int)uVar17 + 1;
          log_console = (wchar_t)(verbosity == L'\x01');
          uVar17 = 0;
          do {
            if ((1 < failed_lines[uVar17].count) && (failed_lines[uVar17].skip == 0)) {
              logprintf("%s:%d: Summary: Failed %d times\n",failed_filename,uVar17 & 0xffffffff);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != 10000);
          failed_filename = (char *)0x0;
          memset(failed_lines,0,80000);
          fclose((FILE *)logfile);
          logfile = (FILE *)0x0;
          if (((tests[(int)uVar3].failures == 0) && ((keep_temp_files & 1) == 0)) &&
             (wVar4 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                                      ,L'ऱ',local_678), wVar4 != L'\0')) {
            systemf("rm -rf %s",tests[(int)uVar3].name);
            systemf("rm %s",local_578);
          }
          if ((tests[(int)uVar3].failures != 0) &&
             (local_764 = local_764 + 1, until_failure != L'\0')) {
            iVar21 = 0x15;
            uVar17 = (ulong)uVar1;
            goto LAB_001087ab;
          }
          uVar17 = (ulong)uVar1;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar18);
        uVar17 = (ulong)(uVar18 + iVar21);
      }
      local_760 = local_760 + (*local_760 != (char *)0x0);
      iVar21 = 0;
LAB_001087ab:
      if (iVar21 != 0) {
        if (iVar21 != 0x15) {
          return L'\0';
        }
        goto LAB_001087db;
      }
      if ((*local_760 == (char *)0x0) && (local_760 = ppcVar16, until_failure == L'\0')) {
LAB_001087db:
        free(local_748);
        free(__dest);
        free(__s);
        if (L'\xffffffff' < verbosity) {
          putchar(10);
          puts("Totals:");
          printf("  Tests run:         %8d\n",uVar17);
          printf("  Tests failed:      %8d\n",(ulong)local_764);
          printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
          printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
          printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
        }
        if (failures == L'\0') {
          if (verbosity == L'\xffffffff') {
            putchar(10);
          }
          printf("%d tests passed, no failures\n",uVar17);
        }
        else {
          putchar(10);
          puts("Failing tests:");
          piVar22 = &tests[0].failures;
          uVar17 = 0;
          do {
            if (*piVar22 != 0) {
              printf("  %d: %s (%d failures)\n",uVar17 & 0xffffffff,*(char **)(piVar22 + -2));
            }
            uVar17 = uVar17 + 1;
            piVar22 = piVar22 + 6;
          } while (uVar17 != 0x21);
          putchar(10);
          printf("Details for failing tests: %s\n",local_678);
          putchar(10);
        }
        free(local_750);
        assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/main.c"
                        ,L'ଝ',"..");
        rmdir(local_678);
        return (uint)(local_764 != 0);
      }
    } while( true );
  }
  sVar7 = strlen(__s);
  sVar9 = strlen(__dest);
  pcVar10 = __dest;
  __dest = (char *)realloc(__dest,sVar7 + sVar9 + 2);
  if (__dest != (char *)0x0) {
    sVar7 = strlen(__s);
    sVar9 = strlen(__dest);
    memmove(__dest + sVar7 + 1,__dest,sVar9);
    memcpy(__dest,__s,sVar7);
    sVar7 = strlen(__s);
    __dest[sVar7] = '/';
    goto LAB_00107c02;
  }
LAB_00108a29:
  main_cold_1();
LAB_00108a2e:
  main_cold_8();
  printf("Usage: %s [options] <test> <test> ...\n",pcVar10);
  puts("Default is to run all tests.");
  puts("Otherwise, specify the numbers of the tests you wish to run.");
  puts("Options:");
  puts("  -d  Dump core after any failure, for debugging.");
  puts("  -k  Keep all temp files.");
  puts("      Default: temp files for successful tests deleted.");
  puts("  -p <path>  Path to executable to be tested.");
  puts("      Default: path taken from BSDCPIO environment variable.");
  puts("  -q  Quiet.");
  puts("  -r <dir>   Path to dir containing reference files.");
  puts("      Default: Current directory.");
  puts("  -u  Keep running specifies tests until one fails.");
  puts("  -v  Verbose.");
  puts("Available tests:");
  ppcVar16 = &tests[0].name;
  uVar17 = 0;
  do {
    printf("  %d: %s\n",uVar17 & 0xffffffff,*ppcVar16);
    uVar17 = uVar17 + 1;
    ppcVar16 = ppcVar16 + 3;
  } while (uVar17 != 0x21);
  exit(1);
LAB_001089f0:
  printf("*** INVALID Test %s\n",*local_760);
  free(local_750);
  free(local_740);
  usage(local_730);
  pcVar10 = local_730;
LAB_00108a24:
  main_cold_9();
  goto LAB_00108a29;
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = sizeof(tests) / sizeof(tests[0]);
	int test_set[sizeof(tests) / sizeof(tests[0])];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	time_t now;
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
	char tmpdir[256], *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[256];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#ifdef PATH_MAX
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	if ((testprogdir = (char *)malloc(strlen(progname) + 1)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strcpy(testprogdir, progname);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = (char *)realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir));
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		if ((tmp2 = (char *)malloc(strlen(testprogdir) + 1 +
			strlen(PROGRAM) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strcpy(tmp2, testprogdir);
		strcat(tmp2, "/");
		strcat(tmp2, PROGRAM);
		testprogfile = tmp2;
	}

	{
		char *testprg;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg = malloc(strlen(testprogfile) + 3);
		strcpy(testprg, "\"");
		strcat(testprg, testprogfile);
		strcat(testprg, "\"");
		testprog = testprg;
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S",
		    localtime(&now));
		sprintf(tmpdir, "%s/%s.%s-%03d", tmp, progname,
		    tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir,0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv, tests);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
				return (1);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	return (tests_failed ? 1 : 0);
}